

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

uint __thiscall
wasm::Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
          (Visitor<wasm::CostAnalyzer,_unsigned_int> *this,Expression *curr)

{
  uint uVar1;
  CostType CVar2;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      CVar2 = CostAnalyzer::visitBlock((CostAnalyzer *)this,(Block *)curr);
      return CVar2;
    case IfId:
      CVar2 = CostAnalyzer::visitIf((CostAnalyzer *)this,(If *)curr);
      return CVar2;
    case LoopId:
      CVar2 = CostAnalyzer::visitLoop((CostAnalyzer *)this,(Loop *)curr);
      return CVar2;
    case BreakId:
      CVar2 = CostAnalyzer::visitBreak((CostAnalyzer *)this,(Break *)curr);
      return CVar2;
    case SwitchId:
      CVar2 = CostAnalyzer::visitSwitch((CostAnalyzer *)this,(Switch *)curr);
      return CVar2;
    case CallId:
      CVar2 = CostAnalyzer::visitCall((CostAnalyzer *)this,(Call *)curr);
      return CVar2;
    case CallIndirectId:
      CVar2 = CostAnalyzer::visitCallIndirect((CostAnalyzer *)this,(CallIndirect *)curr);
      return CVar2;
    case LocalGetId:
    case NopId:
    case UnreachableId:
    case PopId:
      uVar1 = 0;
      break;
    case LocalSetId:
      CVar2 = CostAnalyzer::visitLocalSet((CostAnalyzer *)this,(LocalSet *)curr);
      return CVar2;
    case GlobalGetId:
    case ConstId:
    case MemorySizeId:
    case RefNullId:
    case RefFuncId:
    case TableSizeId:
      uVar1 = 1;
      break;
    case GlobalSetId:
      CVar2 = CostAnalyzer::visitGlobalSet((CostAnalyzer *)this,(GlobalSet *)curr);
      return CVar2;
    case LoadId:
      CVar2 = CostAnalyzer::visitLoad((CostAnalyzer *)this,(Load *)curr);
      return CVar2;
    case StoreId:
      CVar2 = CostAnalyzer::visitStore((CostAnalyzer *)this,(Store *)curr);
      return CVar2;
    case UnaryId:
      CVar2 = CostAnalyzer::visitUnary((CostAnalyzer *)this,(Unary *)curr);
      return CVar2;
    case BinaryId:
      CVar2 = CostAnalyzer::visitBinary((CostAnalyzer *)this,(Binary *)curr);
      return CVar2;
    case SelectId:
      CVar2 = CostAnalyzer::visitSelect((CostAnalyzer *)this,(Select *)curr);
      return CVar2;
    case DropId:
      CVar2 = CostAnalyzer::visitDrop((CostAnalyzer *)this,(Drop *)curr);
      return CVar2;
    case ReturnId:
      CVar2 = CostAnalyzer::visitReturn((CostAnalyzer *)this,(Return *)curr);
      return CVar2;
    case MemoryGrowId:
      CVar2 = CostAnalyzer::visitMemoryGrow((CostAnalyzer *)this,(MemoryGrow *)curr);
      return CVar2;
    case AtomicRMWId:
      CVar2 = CostAnalyzer::visitAtomicRMW((CostAnalyzer *)this,(AtomicRMW *)curr);
      return CVar2;
    case AtomicCmpxchgId:
      CVar2 = CostAnalyzer::visitAtomicCmpxchg((CostAnalyzer *)this,(AtomicCmpxchg *)curr);
      return CVar2;
    case AtomicWaitId:
      CVar2 = CostAnalyzer::visitAtomicWait((CostAnalyzer *)this,(AtomicWait *)curr);
      return CVar2;
    case AtomicNotifyId:
      CVar2 = CostAnalyzer::visitAtomicNotify((CostAnalyzer *)this,(AtomicNotify *)curr);
      return CVar2;
    case AtomicFenceId:
    case RethrowId:
    case ThrowRefId:
      uVar1 = 10;
      break;
    case SIMDExtractId:
      CVar2 = CostAnalyzer::visitSIMDExtract((CostAnalyzer *)this,(SIMDExtract *)curr);
      return CVar2;
    case SIMDReplaceId:
      CVar2 = CostAnalyzer::visitSIMDReplace((CostAnalyzer *)this,(SIMDReplace *)curr);
      return CVar2;
    case SIMDShuffleId:
      CVar2 = CostAnalyzer::visitSIMDShuffle((CostAnalyzer *)this,(SIMDShuffle *)curr);
      return CVar2;
    case SIMDTernaryId:
      CVar2 = CostAnalyzer::visitSIMDTernary((CostAnalyzer *)this,(SIMDTernary *)curr);
      return CVar2;
    case SIMDShiftId:
      CVar2 = CostAnalyzer::visitSIMDShift((CostAnalyzer *)this,(SIMDShift *)curr);
      return CVar2;
    case SIMDLoadId:
      CVar2 = CostAnalyzer::visitSIMDLoad((CostAnalyzer *)this,(SIMDLoad *)curr);
      return CVar2;
    case SIMDLoadStoreLaneId:
      CVar2 = CostAnalyzer::visitSIMDLoadStoreLane((CostAnalyzer *)this,(SIMDLoadStoreLane *)curr);
      return CVar2;
    case MemoryInitId:
      CVar2 = CostAnalyzer::visitMemoryInit((CostAnalyzer *)this,(MemoryInit *)curr);
      return CVar2;
    case DataDropId:
      uVar1 = 5;
      break;
    case MemoryCopyId:
      CVar2 = CostAnalyzer::visitMemoryCopy((CostAnalyzer *)this,(MemoryCopy *)curr);
      return CVar2;
    case MemoryFillId:
      CVar2 = CostAnalyzer::visitMemoryFill((CostAnalyzer *)this,(MemoryFill *)curr);
      return CVar2;
    case RefIsNullId:
      CVar2 = CostAnalyzer::visitRefIsNull((CostAnalyzer *)this,(RefIsNull *)curr);
      return CVar2;
    case RefEqId:
      CVar2 = CostAnalyzer::visitRefEq((CostAnalyzer *)this,(RefEq *)curr);
      return CVar2;
    case TableGetId:
      CVar2 = CostAnalyzer::visitTableGet((CostAnalyzer *)this,(TableGet *)curr);
      return CVar2;
    case TableSetId:
      CVar2 = CostAnalyzer::visitTableSet((CostAnalyzer *)this,(TableSet *)curr);
      return CVar2;
    case TableGrowId:
      CVar2 = CostAnalyzer::visitTableGrow((CostAnalyzer *)this,(TableGrow *)curr);
      return CVar2;
    case TableFillId:
      CVar2 = CostAnalyzer::visitTableFill((CostAnalyzer *)this,(TableFill *)curr);
      return CVar2;
    case TableCopyId:
      CVar2 = CostAnalyzer::visitTableCopy((CostAnalyzer *)this,(TableCopy *)curr);
      return CVar2;
    case TableInitId:
      CVar2 = CostAnalyzer::visitTableInit((CostAnalyzer *)this,(TableInit *)curr);
      return CVar2;
    case TryId:
      CVar2 = CostAnalyzer::visitTry((CostAnalyzer *)this,(Try *)curr);
      return CVar2;
    case TryTableId:
      CVar2 = CostAnalyzer::visitTryTable((CostAnalyzer *)this,(TryTable *)curr);
      return CVar2;
    case ThrowId:
      CVar2 = CostAnalyzer::visitThrow((CostAnalyzer *)this,(Throw *)curr);
      return CVar2;
    case TupleMakeId:
      CVar2 = CostAnalyzer::visitTupleMake((CostAnalyzer *)this,(TupleMake *)curr);
      return CVar2;
    case TupleExtractId:
      CVar2 = CostAnalyzer::visitTupleExtract((CostAnalyzer *)this,(TupleExtract *)curr);
      return CVar2;
    case RefI31Id:
      CVar2 = CostAnalyzer::visitRefI31((CostAnalyzer *)this,(RefI31 *)curr);
      return CVar2;
    case I31GetId:
      CVar2 = CostAnalyzer::visitI31Get((CostAnalyzer *)this,(I31Get *)curr);
      return CVar2;
    case CallRefId:
      CVar2 = CostAnalyzer::visitCallRef((CostAnalyzer *)this,(CallRef *)curr);
      return CVar2;
    case RefTestId:
      CVar2 = CostAnalyzer::visitRefTest((CostAnalyzer *)this,(RefTest *)curr);
      return CVar2;
    case RefCastId:
      CVar2 = CostAnalyzer::visitRefCast((CostAnalyzer *)this,(RefCast *)curr);
      return CVar2;
    case BrOnId:
      CVar2 = CostAnalyzer::visitBrOn((CostAnalyzer *)this,(BrOn *)curr);
      return CVar2;
    case StructNewId:
      CVar2 = CostAnalyzer::visitStructNew((CostAnalyzer *)this,(StructNew *)curr);
      return CVar2;
    case StructGetId:
      CVar2 = CostAnalyzer::visitStructGet((CostAnalyzer *)this,(StructGet *)curr);
      return CVar2;
    case StructSetId:
      CVar2 = CostAnalyzer::visitStructSet((CostAnalyzer *)this,(StructSet *)curr);
      return CVar2;
    case StructRMWId:
      CVar2 = CostAnalyzer::visitStructRMW((CostAnalyzer *)this,(StructRMW *)curr);
      return CVar2;
    case StructCmpxchgId:
      CVar2 = CostAnalyzer::visitStructCmpxchg((CostAnalyzer *)this,(StructCmpxchg *)curr);
      return CVar2;
    case ArrayNewId:
      CVar2 = CostAnalyzer::visitArrayNew((CostAnalyzer *)this,(ArrayNew *)curr);
      return CVar2;
    case ArrayNewDataId:
      CVar2 = CostAnalyzer::visitArrayNewData((CostAnalyzer *)this,(ArrayNewData *)curr);
      return CVar2;
    case ArrayNewElemId:
      CVar2 = CostAnalyzer::visitArrayNewElem((CostAnalyzer *)this,(ArrayNewElem *)curr);
      return CVar2;
    case ArrayNewFixedId:
      CVar2 = CostAnalyzer::visitArrayNewFixed((CostAnalyzer *)this,(ArrayNewFixed *)curr);
      return CVar2;
    case ArrayGetId:
      CVar2 = CostAnalyzer::visitArrayGet((CostAnalyzer *)this,(ArrayGet *)curr);
      return CVar2;
    case ArraySetId:
      CVar2 = CostAnalyzer::visitArraySet((CostAnalyzer *)this,(ArraySet *)curr);
      return CVar2;
    case ArrayLenId:
      CVar2 = CostAnalyzer::visitArrayLen((CostAnalyzer *)this,(ArrayLen *)curr);
      return CVar2;
    case ArrayCopyId:
      CVar2 = CostAnalyzer::visitArrayCopy((CostAnalyzer *)this,(ArrayCopy *)curr);
      return CVar2;
    case ArrayFillId:
      CVar2 = CostAnalyzer::visitArrayFill((CostAnalyzer *)this,(ArrayFill *)curr);
      return CVar2;
    case ArrayInitDataId:
      CVar2 = CostAnalyzer::visitArrayInitData((CostAnalyzer *)this,(ArrayInitData *)curr);
      return CVar2;
    case ArrayInitElemId:
      CVar2 = CostAnalyzer::visitArrayInitElem((CostAnalyzer *)this,(ArrayInitElem *)curr);
      return CVar2;
    case RefAsId:
      CVar2 = CostAnalyzer::visitRefAs((CostAnalyzer *)this,(RefAs *)curr);
      return CVar2;
    case StringNewId:
      CVar2 = CostAnalyzer::visitStringNew((CostAnalyzer *)this,(StringNew *)curr);
      return CVar2;
    case StringConstId:
      uVar1 = 4;
      break;
    case StringMeasureId:
      CVar2 = CostAnalyzer::visitStringMeasure((CostAnalyzer *)this,(StringMeasure *)curr);
      return CVar2;
    case StringEncodeId:
      CVar2 = CostAnalyzer::visitStringEncode((CostAnalyzer *)this,(StringEncode *)curr);
      return CVar2;
    case StringConcatId:
      CVar2 = CostAnalyzer::visitStringConcat((CostAnalyzer *)this,(StringConcat *)curr);
      return CVar2;
    case StringEqId:
      CVar2 = CostAnalyzer::visitStringEq((CostAnalyzer *)this,(StringEq *)curr);
      return CVar2;
    case StringWTF16GetId:
      CVar2 = CostAnalyzer::visitStringWTF16Get((CostAnalyzer *)this,(StringWTF16Get *)curr);
      return CVar2;
    case StringSliceWTFId:
      CVar2 = CostAnalyzer::visitStringSliceWTF((CostAnalyzer *)this,(StringSliceWTF *)curr);
      return CVar2;
    case ContNewId:
      CVar2 = CostAnalyzer::visitContNew((CostAnalyzer *)this,(ContNew *)curr);
      return CVar2;
    case ContBindId:
      CVar2 = CostAnalyzer::visitContBind((CostAnalyzer *)this,(ContBind *)curr);
      return CVar2;
    case SuspendId:
      CVar2 = CostAnalyzer::visitSuspend((CostAnalyzer *)this,(Suspend *)curr);
      return CVar2;
    case ResumeId:
      CVar2 = CostAnalyzer::visitResume((CostAnalyzer *)this,(Resume *)curr);
      return CVar2;
    case ResumeThrowId:
      CVar2 = CostAnalyzer::visitResumeThrow((CostAnalyzer *)this,(ResumeThrow *)curr);
      return CVar2;
    case StackSwitchId:
      CVar2 = CostAnalyzer::visitStackSwitch((CostAnalyzer *)this,(StackSwitch *)curr);
      return CVar2;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return uVar1;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::CostAnalyzer, unsigned int>::visit(Expression *) [SubType = wasm::CostAnalyzer, ReturnType = unsigned int]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }